

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O3

char * findLikelySubtags(char *localeID,char *buffer,int32_t bufferLength,UErrorCode *err)

{
  UResourceBundle *resB;
  UChar *us;
  undefined4 in_register_00000014;
  UErrorCode *pUVar1;
  int32_t resLen;
  UErrorCode tmpErr;
  int32_t local_30;
  UErrorCode local_2c;
  
  pUVar1 = (UErrorCode *)CONCAT44(in_register_00000014,bufferLength);
  if (U_ZERO_ERROR < *pUVar1) {
    return (char *)0x0;
  }
  local_30 = 0;
  local_2c = U_ZERO_ERROR;
  resB = ures_openDirect_63((char *)0x0,"likelySubtags",&local_2c);
  if (U_ZERO_ERROR < local_2c) {
    *pUVar1 = local_2c;
    return (char *)0x0;
  }
  us = ures_getStringByKey_63(resB,localeID,&local_30,&local_2c);
  if (local_2c < U_ILLEGAL_ARGUMENT_ERROR) {
    if (local_30 < 0x9d) {
      u_UCharsToChars_63(us,buffer,local_30 + 1);
      goto LAB_00287244;
    }
    *pUVar1 = U_INTERNAL_PROGRAM_ERROR;
  }
  else if (local_2c != U_MISSING_RESOURCE_ERROR) {
    *pUVar1 = local_2c;
  }
  buffer = (char *)0x0;
LAB_00287244:
  ures_close_63(resB);
  return buffer;
}

Assistant:

static const char*  U_CALLCONV
findLikelySubtags(const char* localeID,
                  char* buffer,
                  int32_t bufferLength,
                  UErrorCode* err) {
    const char* result = NULL;

    if (!U_FAILURE(*err)) {
        int32_t resLen = 0;
        const UChar* s = NULL;
        UErrorCode tmpErr = U_ZERO_ERROR;
        UResourceBundle* subtags = ures_openDirect(NULL, "likelySubtags", &tmpErr);
        if (U_SUCCESS(tmpErr)) {
            s = ures_getStringByKey(subtags, localeID, &resLen, &tmpErr);

            if (U_FAILURE(tmpErr)) {
                /*
                 * If a resource is missing, it's not really an error, it's
                 * just that we don't have any data for that particular locale ID.
                 */
                if (tmpErr != U_MISSING_RESOURCE_ERROR) {
                    *err = tmpErr;
                }
            }
            else if (resLen >= bufferLength) {
                /* The buffer should never overflow. */
                *err = U_INTERNAL_PROGRAM_ERROR;
            }
            else {
                u_UCharsToChars(s, buffer, resLen + 1);
                result = buffer;
            }

            ures_close(subtags);
        } else {
            *err = tmpErr;
        }
    }

    return result;
}